

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

string * absl::lts_20240722::StrCat<>
                   (string *__return_storage_ptr__,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d,
                   AlphaNum *e)

{
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view *local_48;
  undefined8 local_40;
  AlphaNum *local_38;
  AlphaNum *e_local;
  AlphaNum *d_local;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  
  local_38 = e;
  e_local = d;
  d_local = c;
  c_local = b;
  b_local = a;
  a_local = (AlphaNum *)__return_storage_ptr__;
  local_98 = AlphaNum::Piece(a);
  local_88 = AlphaNum::Piece(c_local);
  local_78 = AlphaNum::Piece(d_local);
  local_68 = AlphaNum::Piece(e_local);
  local_58 = AlphaNum::Piece(local_38);
  local_48 = &local_98;
  local_40 = 5;
  absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(__return_storage_ptr__,local_48,5);
  return __return_storage_ptr__;
}

Assistant:

ABSL_MUST_USE_RESULT inline std::string StrCat(
    const AlphaNum& a, const AlphaNum& b, const AlphaNum& c, const AlphaNum& d,
    const AlphaNum& e, const AV&... args) {
  return strings_internal::CatPieces(
      {a.Piece(), b.Piece(), c.Piece(), d.Piece(), e.Piece(),
       static_cast<const AlphaNum&>(args).Piece()...});
}